

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockParameterTest_twoOutputParameterOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_TestShell
::createTest(TEST_MockParameterTest_twoOutputParameterOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_TestShell
             *this)

{
  Utest *this_00;
  TEST_MockParameterTest_twoOutputParameterOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_TestShell
  *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
                                  ,0x30e);
  TEST_MockParameterTest_twoOutputParameterOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_Test
  ::
  TEST_MockParameterTest_twoOutputParameterOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_Test
            ((TEST_MockParameterTest_twoOutputParameterOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_Test
              *)this_00);
  return this_00;
}

Assistant:

TEST(MockParameterTest, twoOutputParameterOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds)
{
    int param1 = 1;
    int param2 = 1;
    int retval1 = 2;
    int retval2 = 3;

    mock().expectOneCall("foo").withOutputParameterReturning("bar", &retval1, sizeof(retval1));
    mock().expectOneCall("foo").withOutputParameterReturning("bar", &retval2, sizeof(retval2));
    mock().actualCall("foo").withOutputParameter("bar", &param1);
    mock().actualCall("foo").withOutputParameter("bar", &param2);

    CHECK_EQUAL(2, retval1);
    CHECK_EQUAL(2, param1);
    CHECK_EQUAL(3, retval2);
    CHECK_EQUAL(3, param2);
    mock().checkExpectations();
}